

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

float __thiscall
duckdb::Interpolator<false>::Operation<float,float,duckdb::QuantileDirect<float>>
          (Interpolator<false> *this,float *v_t,Vector *result,QuantileDirect<float> *accessor)

{
  float fVar1;
  idx_t iVar2;
  idx_t iVar3;
  idx_t iVar4;
  long lVar5;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<float>_>_> __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<float>_>_> __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<float>_>_> __comp_01;
  float fVar6;
  bool bVar7;
  ulong uVar8;
  InvalidInputException *pIVar9;
  duckdb *pdVar10;
  float result_1;
  float local_4c;
  string local_48;
  float local_24;
  
  bVar7 = this->desc;
  iVar2 = this->FRN;
  iVar3 = this->begin;
  iVar4 = this->end;
  local_48._M_dataplus._M_p = (pointer)accessor;
  local_48._M_string_length = (size_type)accessor;
  local_48.field_2._M_local_buf[0] = bVar7;
  if (this->CRN == iVar2) {
    if (iVar2 != iVar4 && iVar3 != iVar4) {
      uVar8 = (long)(iVar4 * 4 + iVar3 * -4) >> 2;
      lVar5 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_48.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar7;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      std::
      __introselect<float*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<float>>>>
                (v_t + iVar3,v_t + iVar2,v_t + iVar4,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
    }
    fVar1 = v_t[this->FRN];
    pdVar10 = (duckdb *)0x0;
    bVar7 = duckdb::TryCast::Operation<float,float>(fVar1,&local_4c,false);
    if (!bVar7) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<float,float>(&local_48,pdVar10,fVar1);
      duckdb::InvalidInputException::InvalidInputException(pIVar9,(string *)&local_48);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if (iVar2 != iVar4 && iVar3 != iVar4) {
      uVar8 = (long)(iVar4 * 4 + iVar3 * -4) >> 2;
      lVar5 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_48.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar7;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      std::
      __introselect<float*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<float>>>>
                (v_t + iVar3,v_t + iVar2,v_t + iVar4,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
    }
    iVar2 = this->FRN;
    iVar3 = this->end;
    local_48._M_dataplus._M_p = (pointer)accessor;
    local_48._M_string_length = (size_type)accessor;
    local_48.field_2._M_local_buf[0] = bVar7;
    if (this->CRN != iVar3 && iVar2 != iVar3) {
      uVar8 = (long)(iVar3 * 4 + iVar2 * -4) >> 2;
      lVar5 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_48.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar7;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      std::
      __introselect<float*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<float>>>>
                (v_t + iVar2,v_t + this->CRN,v_t + iVar3,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
    }
    fVar1 = v_t[this->FRN];
    pdVar10 = (duckdb *)0x0;
    bVar7 = duckdb::TryCast::Operation<float,float>(fVar1,&local_4c,false);
    fVar6 = local_4c;
    if (!bVar7) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<float,float>(&local_48,pdVar10,fVar1);
      duckdb::InvalidInputException::InvalidInputException(pIVar9,(string *)&local_48);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    local_24 = v_t[this->CRN];
    pdVar10 = (duckdb *)0x0;
    bVar7 = duckdb::TryCast::Operation<float,float>(local_24,&local_4c,false);
    if (!bVar7) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<float,float>(&local_48,pdVar10,local_24);
      duckdb::InvalidInputException::InvalidInputException(pIVar9,(string *)&local_48);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    local_4c = (float)((double)(local_4c - fVar6) *
                       (this->RN -
                       (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                        1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                      (double)fVar6);
  }
  return local_4c;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}